

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int check_acl(mg_context *phys_ctx,usa *sa)

{
  byte bVar1;
  int iVar2;
  char *list;
  byte *in_RCX;
  char *extraout_RDX;
  char *pcVar3;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  int iVar4;
  bool bVar5;
  vec vec;
  vec local_40;
  
  pcVar3 = (phys_ctx->dd).config[0x25];
  bVar5 = pcVar3 == (char *)0x0;
  list = next_option(pcVar3,&local_40,(vec *)0x0);
  if (list != (char *)0x0) {
    iVar4 = (uint)(pcVar3 != (char *)0x0) * 2 + 0x2b;
    pcVar3 = extraout_RDX;
    do {
      if (local_40.len == 0) {
LAB_001284fd:
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,pcVar3,(uint)in_RCX,
                   "%s: subnet must be [+|-]IP-addr[/x]","check_acl");
        return -1;
      }
      bVar1 = *local_40.ptr;
      if ((bVar1 != 0x2d) &&
         (pcVar3 = (char *)(ulong)bVar1, in_RCX = (byte *)local_40.ptr, bVar1 != 0x2b))
      goto LAB_001284fd;
      in_RCX = (byte *)(local_40.ptr + 1);
      local_40.len = local_40.len - 1;
      local_40.ptr = (char *)in_RCX;
      iVar2 = parse_match_net(&local_40,sa,1);
      pcVar3 = extraout_RDX_00;
      if (iVar2 < 0) goto LAB_001284fd;
      if (iVar2 != 0) {
        iVar4 = (int)(char)bVar1;
      }
      list = next_option(list,&local_40,(vec *)0x0);
      pcVar3 = extraout_RDX_01;
    } while (list != (char *)0x0);
    bVar5 = iVar4 == 0x2b;
  }
  return (uint)bVar5;
}

Assistant:

static int
check_acl(struct mg_context *phys_ctx, const union usa *sa)
{
	int allowed, flag, matched;
	struct vec vec;

	if (phys_ctx) {
		const char *list = phys_ctx->dd.config[ACCESS_CONTROL_LIST];

		/* If any ACL is set, deny by default */
		allowed = (list == NULL) ? '+' : '-';

		while ((list = next_option(list, &vec, NULL)) != NULL) {
			flag = vec.ptr[0];
			matched = -1;
			if ((vec.len > 0) && ((flag == '+') || (flag == '-'))) {
				vec.ptr++;
				vec.len--;
				matched = parse_match_net(&vec, sa, 1);
			}
			if (matched < 0) {
				mg_cry_ctx_internal(phys_ctx,
				                    "%s: subnet must be [+|-]IP-addr[/x]",
				                    __func__);
				return -1;
			}
			if (matched) {
				allowed = flag;
			}
		}

		return allowed == '+';
	}
	return -1;
}